

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O3

void __thiscall rw::World::enumerateLights(World *this,WorldLights *lightData)

{
  undefined8 uVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  LLLink *pLVar5;
  ulong uVar6;
  LLLink *pLVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  iVar3 = lightData->numDirectionals;
  uVar4 = lightData->numLocals;
  lightData->numLocals = 0;
  fVar12 = 0.0;
  fVar13 = 0.0;
  lightData->numAmbients = 0;
  (lightData->ambient).red = 0.0;
  (lightData->ambient).green = 0.0;
  (lightData->ambient).blue = 0.0;
  *(undefined8 *)&(lightData->ambient).alpha = 0x3f800000;
  pLVar7 = (this->globalLights).link.next;
  if (pLVar7 != &(this->globalLights).link) {
    fVar14 = 0.0;
    iVar9 = 0;
    iVar10 = 0;
    do {
      pLVar5 = pLVar7->next;
      cVar2 = *(char *)((long)&pLVar7[-4].next + 1);
      if (cVar2 == '\x01') {
        if (iVar10 < iVar3) {
          lVar11 = (long)iVar10;
          iVar10 = iVar10 + 1;
          lightData->numDirectionals = iVar10;
          lightData->directionals[lVar11] = (Light *)(pLVar7 + -4);
        }
      }
      else if (cVar2 == '\x02') {
        uVar1 = *(undefined8 *)((long)&pLVar7[-2].prev + 4);
        fVar12 = fVar12 + (float)uVar1;
        fVar13 = fVar13 + (float)((ulong)uVar1 >> 0x20);
        (lightData->ambient).red = (float32)fVar12;
        (lightData->ambient).green = (float32)fVar13;
        fVar14 = fVar14 + *(float *)((long)&pLVar7[-1].next + 4);
        (lightData->ambient).blue = (float32)fVar14;
        iVar9 = iVar9 + 1;
        lightData->numAmbients = iVar9;
      }
      pLVar7 = pLVar5;
    } while (pLVar5 != &(this->globalLights).link);
  }
  pLVar7 = (this->localLights).link.next;
  if (pLVar7 != &(this->localLights).link) {
    uVar8 = 0;
    uVar6 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar6 = uVar8;
    }
    do {
      if (uVar6 == uVar8) {
        return;
      }
      pLVar5 = pLVar7->next;
      lightData->numLocals = (int32)(uVar8 + 1);
      lightData->locals[uVar8] = (Light *)(pLVar7 + -4);
      pLVar7 = pLVar5;
      uVar8 = uVar8 + 1;
    } while (pLVar5 != &(this->localLights).link);
  }
  return;
}

Assistant:

void
World::enumerateLights(WorldLights *lightData)
{
	int32 maxDirectionals, maxLocals;

	maxDirectionals = lightData->numDirectionals;
	maxLocals = lightData->numLocals;

	lightData->numDirectionals = 0;
	lightData->numLocals = 0;
	lightData->numAmbients = 0;
	lightData->ambient.red = 0.0f;
	lightData->ambient.green = 0.0f;
	lightData->ambient.blue = 0.0f;
	lightData->ambient.alpha = 1.0f;

	FORLIST(lnk, this->globalLights){
		Light *l = Light::fromWorld(lnk);
		if(l->getType() == Light::AMBIENT){
			lightData->ambient.red   += l->color.red;
			lightData->ambient.green += l->color.green;
			lightData->ambient.blue  += l->color.blue;
			lightData->numAmbients++;
		}else if(l->getType() == Light::DIRECTIONAL){
			if(lightData->numDirectionals < maxDirectionals)
				lightData->directionals[lightData->numDirectionals++] = l;
		}
	}

	FORLIST(lnk, this->localLights){
		if(lightData->numLocals >= maxLocals)
			return;

		Light *l = Light::fromWorld(lnk);
		lightData->locals[lightData->numLocals++] = l;
	}
}